

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfw.c
# Opt level: O1

void MMFW_FreeEntry(MMFWEntry *entry)

{
  MMFWKind MVar1;
  
  if (entry != (MMFWEntry *)0x0) {
    MVar1 = entry->kind;
    if (MVar1 == MMFW_KIND_FILMS) {
      MMFWFilmEntry_Free((entry->entry).film);
    }
    else if (MVar1 == MMFW_KIND_PICTURES) {
      MMFWPictureEntry_Free((entry->entry).picture);
    }
    else if (MVar1 == MMFW_KIND_SOUNDS) {
      MMFWSoundEntry_Free((entry->entry).sound);
    }
    free(entry);
    return;
  }
  return;
}

Assistant:

void
MMFW_FreeEntry(MMFWEntry *entry)
{
	if (!entry) return;

	switch (entry->kind) {
	case MMFW_KIND_SOUNDS:
		MMFWSoundEntry_Free(entry->entry.sound);
		break;
	case MMFW_KIND_PICTURES:
		MMFWPictureEntry_Free(entry->entry.picture);
		break;
	case MMFW_KIND_FILMS:
		MMFWFilmEntry_Free(entry->entry.film);
		break;
	default:
		; /* XXX NOTREACHED */
	}

	free(entry);
}